

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O1

recv_result_t __thiscall
zmq::detail::recv_multipart_n<true,zmq::message_t*>
          (detail *this,socket_ref s,message_t *out,size_t n,recv_flags flags)

{
  int iVar1;
  runtime_error *this_00;
  ulong extraout_RDX;
  _Storage<unsigned_long,_true> _Var2;
  void *__buf;
  undefined8 uVar3;
  recv_result_t rVar4;
  message_t msg;
  message_t local_b8;
  uchar local_78 [8];
  uchar auStack_70 [8];
  uchar local_68 [8];
  uchar auStack_60 [8];
  uchar local_58 [8];
  uchar auStack_50 [8];
  uchar local_48 [8];
  uchar auStack_40 [8];
  socket_base local_38;
  
  __buf = (void *)(n & 0xffffffff);
  local_38._handle = this;
  message_t::message_t(&local_b8);
  _Var2._M_value = 0;
  while( true ) {
    if (out == (message_t *)_Var2._M_value) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Too many message parts in recv_multipart_n");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    socket_base::recv(&local_38,(int)&local_b8,__buf,n,flags);
    if ((extraout_RDX & 1) == 0) break;
    iVar1 = zmq_msg_more(&local_b8);
    _Var2._M_value = _Var2._M_value + 1;
    local_78 = *(uchar (*) [8])s.super_socket_base._handle;
    auStack_70 = *(uchar (*) [8])((long)s.super_socket_base._handle + 8);
    local_68 = *(uchar (*) [8])((long)s.super_socket_base._handle + 0x10);
    auStack_60 = *(uchar (*) [8])((long)s.super_socket_base._handle + 0x18);
    local_58 = *(uchar (*) [8])((long)s.super_socket_base._handle + 0x20);
    auStack_50 = *(uchar (*) [8])((long)s.super_socket_base._handle + 0x28);
    local_48 = *(uchar (*) [8])((long)s.super_socket_base._handle + 0x30);
    auStack_40 = *(uchar (*) [8])((long)s.super_socket_base._handle + 0x38);
    *(undefined8 *)((long)s.super_socket_base._handle + 0x30) = local_b8.msg._._48_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x38) = local_b8.msg._._56_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x20) = local_b8.msg._._32_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x28) = local_b8.msg._._40_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x10) = local_b8.msg._._16_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 0x18) = local_b8.msg._._24_8_;
    *(undefined8 *)s.super_socket_base._handle = local_b8.msg._._0_8_;
    *(undefined8 *)((long)s.super_socket_base._handle + 8) = local_b8.msg._._8_8_;
    s.super_socket_base._handle = (socket_base)((long)s.super_socket_base._handle + 0x40);
    local_b8.msg._._0_8_ = local_78;
    local_b8.msg._._8_8_ = auStack_70;
    local_b8.msg._._16_8_ = local_68;
    local_b8.msg._._24_8_ = auStack_60;
    local_b8.msg._._32_8_ = local_58;
    local_b8.msg._._40_8_ = auStack_50;
    local_b8.msg._._48_8_ = local_48;
    local_b8.msg._._56_8_ = auStack_40;
    if (iVar1 == 0) {
      uVar3 = CONCAT71((int7)((ulong)__buf >> 8),1);
LAB_00146994:
      message_t::~message_t(&local_b8);
      rVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
      rVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = _Var2._M_value;
      return (recv_result_t)
             rVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
  }
  if ((uchar *)_Var2._M_value != (uchar *)0x0) {
    __assert_fail("msg_count == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp",
                  0x75,
                  "recv_result_t zmq::detail::recv_multipart_n(socket_ref, OutputIt, size_t, recv_flags) [CheckN = true, OutputIt = zmq::message_t *]"
                 );
  }
  uVar3 = 0;
  _Var2._M_value = 0;
  goto LAB_00146994;
}

Assistant:

recv_result_t
recv_multipart_n(socket_ref s, OutputIt out, size_t n, recv_flags flags)
{
    size_t msg_count = 0;
    message_t msg;
    while (true) {
        if ZMQ_CONSTEXPR_IF (CheckN) {
            if (msg_count >= n)
                throw std::runtime_error(
                  "Too many message parts in recv_multipart_n");
        }
        if (!s.recv(msg, flags)) {
            // zmq ensures atomic delivery of messages
            assert(msg_count == 0);
            return {};
        }
        ++msg_count;
        const bool more = msg.more();
        *out++ = std::move(msg);
        if (!more)
            break;
    }
    return msg_count;
}